

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uint128.cpp
# Opt level: O1

void __thiscall UInt128_Equal_Test::~UInt128_Equal_Test(UInt128_Equal_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (UInt128, Equal) {
    constexpr auto high = std::uint64_t{7};
    constexpr auto low = std::uint64_t{5};

    pstore::uint128 v1{high, low};
    pstore::uint128 v2{high, low};
    pstore::uint128 v3{high, low + 1};
    pstore::uint128 v4{high + 1, low};

    EXPECT_TRUE (v1 == v2);
    EXPECT_FALSE (v1 != v2);
    EXPECT_FALSE (v1 == v3);
    EXPECT_TRUE (v1 != v3);
    EXPECT_FALSE (v1 == v4);
    EXPECT_TRUE (v1 != v4);

    EXPECT_TRUE (pstore::uint128{5U} == 5U);
    EXPECT_TRUE (pstore::uint128{5U} != 6U);
}